

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MaskInvertCase::drawPattern
          (MaskInvertCase *this,bool invert)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  float fVar3;
  float fVar4;
  uint local_88;
  Vector<float,_2> local_74;
  Vector<float,_2> local_6c;
  Vector<float,_2> local_64;
  uint local_5c;
  undefined1 local_55;
  GLbitfield maskMask;
  deUint32 dStack_50;
  bool isFinalWord;
  GLbitfield mask;
  GLbitfield rawMask;
  int wordNdx;
  GLbitfield finalWordMask;
  GLbitfield finalWordBits;
  int wordCount;
  Vec4 color;
  float angle1;
  float angle0;
  int triNdx;
  Functions *gl;
  int numTriangles;
  bool invert_local;
  MaskInvertCase *this_local;
  
  pRVar2 = gles31::Context::getRenderContext
                     ((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  for (angle1 = 0.0; (int)angle1 < 0x19; angle1 = (float)((int)angle1 + 1)) {
    color.m_data[3] = ((float)(int)angle1 * 6.2831855) / 25.0;
    color.m_data[2] = (((float)(int)angle1 + 0.5) * 6.2831855) / 25.0;
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)&finalWordBits,((float)(int)angle1 / 25.0) * 0.6 + 0.4,
               ((float)(int)angle1 / 25.0) * 0.3 + 0.5,-((float)(int)angle1 / 25.0) * 0.5 + 0.6,
               -((float)(int)angle1 / 25.0) * 0.7 + 0.7);
    finalWordMask =
         getEffectiveSampleMaskWordCount((this->super_DefaultFBOMultisampleCase).m_numSamples + -1);
    wordNdx = (this->super_DefaultFBOMultisampleCase).m_numSamples +
              (((this->super_DefaultFBOMultisampleCase).m_numSamples + -1) / 0x20) * -0x20;
    rawMask = deBitMask32(0,wordNdx);
    for (mask = 0; (int)mask < (int)finalWordMask; mask = mask + 1) {
      dStack_50 = deUint32Hash(mask * 0x20 + (int)angle1);
      local_88 = dStack_50;
      if (invert) {
        local_88 = dStack_50 ^ 0xffffffff;
      }
      maskMask = local_88;
      local_55 = mask + 1 == finalWordMask;
      local_5c = rawMask;
      if (!(bool)local_55) {
        local_5c = 0xffffffff;
      }
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1258))(mask,local_88 & local_5c);
    }
    err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(err,"glSampleMaski",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x20b);
    tcu::Vector<float,_2>::Vector(&local_64,0.0,0.0);
    fVar3 = ::deFloatCos(color.m_data[3]);
    fVar4 = ::deFloatSin(color.m_data[3]);
    tcu::Vector<float,_2>::Vector(&local_6c,fVar3 * 0.95,fVar4 * 0.95);
    fVar3 = ::deFloatCos(color.m_data[2]);
    fVar4 = ::deFloatSin(color.m_data[2]);
    tcu::Vector<float,_2>::Vector(&local_74,fVar3 * 0.95,fVar4 * 0.95);
    DefaultFBOMultisampleCase::renderTriangle
              (&this->super_DefaultFBOMultisampleCase,&local_64,&local_6c,&local_74,
               (Vec4 *)&finalWordBits);
  }
  return;
}

Assistant:

void MaskInvertCase::drawPattern (bool invert) const
{
	const int				numTriangles	= 25;
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();

	for (int triNdx = 0; triNdx < numTriangles; triNdx++)
	{
		const float	angle0	= 2.0f*DE_PI * (float)triNdx			/ (float)numTriangles;
		const float	angle1	= 2.0f*DE_PI * ((float)triNdx + 0.5f)	/ (float)numTriangles;
		const Vec4	color	= Vec4(0.4f + (float)triNdx/(float)numTriangles*0.6f,
		                           0.5f + (float)triNdx/(float)numTriangles*0.3f,
		                           0.6f - (float)triNdx/(float)numTriangles*0.5f,
		                           0.7f - (float)triNdx/(float)numTriangles*0.7f);


		const int			wordCount		= getEffectiveSampleMaskWordCount(m_numSamples - 1);
		const GLbitfield	finalWordBits	= m_numSamples - 32 * ((m_numSamples-1) / 32);
		const GLbitfield	finalWordMask	= (GLbitfield)deBitMask32(0, (int)finalWordBits);

		for (int wordNdx = 0; wordNdx < wordCount; ++wordNdx)
		{
			const GLbitfield	rawMask		= (GLbitfield)deUint32Hash(wordNdx * 32 + triNdx);
			const GLbitfield	mask		= (invert) ? (~rawMask) : (rawMask);
			const bool			isFinalWord	= (wordNdx + 1) == wordCount;
			const GLbitfield	maskMask	= (isFinalWord) ? (finalWordMask) : (0xFFFFFFFFUL); // maskMask prevents setting coverage bits higher than sample count

			gl.sampleMaski(wordNdx, mask & maskMask);
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "glSampleMaski");

		renderTriangle(Vec2(0.0f, 0.0f),
					   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
					   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
					   color);
	}
}